

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PoolAlloc.cpp
# Opt level: O1

void __thiscall
glslang::TPoolAllocator::TPoolAllocator
          (TPoolAllocator *this,int growthIncrement,int allocationAlignment)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  
  this->pageSize = (long)growthIncrement;
  this->alignment = (long)allocationAlignment;
  this->freeList = (tHeader *)0x0;
  this->inUseList = (tHeader *)0x0;
  (this->stack).
  super__Vector_base<glslang::TPoolAllocator::tAllocState,_std::allocator<glslang::TPoolAllocator::tAllocState>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->stack).
  super__Vector_base<glslang::TPoolAllocator::tAllocState,_std::allocator<glslang::TPoolAllocator::tAllocState>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->stack).
           super__Vector_base<glslang::TPoolAllocator::tAllocState,_std::allocator<glslang::TPoolAllocator::tAllocState>_>
           ._M_impl.super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->stack).
           super__Vector_base<glslang::TPoolAllocator::tAllocState,_std::allocator<glslang::TPoolAllocator::tAllocState>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  if ((uint)growthIncrement < 0x1000) {
    this->pageSize = 0x1000;
  }
  this->currentPageOffset = this->pageSize;
  uVar2 = 8;
  if (7 < (uint)allocationAlignment) {
    uVar2 = (long)allocationAlignment & 0xfffffffffffffff8;
  }
  this->alignment = uVar2;
  uVar1 = 1;
  do {
    uVar3 = uVar1;
    uVar1 = uVar3 * 2;
  } while (uVar3 < uVar2);
  this->alignment = uVar3;
  this->alignmentMask = uVar3 - 1;
  this->headerSkip = -uVar3 & uVar3 + 0x17;
  push(this);
  return;
}

Assistant:

TPoolAllocator::TPoolAllocator(int growthIncrement, int allocationAlignment) :
    pageSize(growthIncrement),
    alignment(allocationAlignment),
    freeList(nullptr),
    inUseList(nullptr),
    numCalls(0)
{
    //
    // Don't allow page sizes we know are smaller than all common
    // OS page sizes.
    //
    if (pageSize < 4*1024)
        pageSize = 4*1024;

    //
    // A large currentPageOffset indicates a new page needs to
    // be obtained to allocate memory.
    //
    currentPageOffset = pageSize;

    //
    // Adjust alignment to be at least pointer aligned and
    // power of 2.
    //
    size_t minAlign = sizeof(void*);
    alignment &= ~(minAlign - 1);
    if (alignment < minAlign)
        alignment = minAlign;
    size_t a = 1;
    while (a < alignment)
        a <<= 1;
    alignment = a;
    alignmentMask = a - 1;

    //
    // Align header skip
    //
    headerSkip = minAlign;
    if (headerSkip < sizeof(tHeader)) {
        headerSkip = (sizeof(tHeader) + alignmentMask) & ~alignmentMask;
    }

    push();
}